

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O3

void __thiscall
RenX_LoggingPlugin::RenX_OnDonate
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *donor,PlayerInfo *player,
          double amount)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  code *pcVar4;
  string msg;
  long *local_78;
  long local_70;
  long local_68 [2];
  double local_58;
  string local_50;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x35 & 1) == 0) {
    pcVar4 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar4 = RenX::Server::sendLogChan;
  }
  pcVar1 = (this->donateFmt)._M_dataplus._M_p;
  local_78 = local_68;
  local_58 = amount;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (this->donateFmt)._M_string_length);
  if (local_70 != 0) {
    RenX::processTags((string *)&local_78,server,donor,player,(BuildingInfo *)0x0);
    uVar2 = *(undefined8 *)(RenX::tags + 0x14e8);
    uVar3 = *(undefined8 *)(RenX::tags + 0x14f0);
    string_printf_abi_cxx11_(&local_50,"%.0f",local_58);
    RenX::replace_tag(&local_78,uVar3,uVar2,local_50._M_string_length,local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    (*pcVar4)(server,local_70,local_78);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnDonate(RenX::Server &server, const RenX::PlayerInfo &donor, const RenX::PlayerInfo &player, double amount)
{
	logFuncType func;
	if (RenX_LoggingPlugin::donatePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->donateFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &donor, &player);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_OBJECT_TAG, string_printf("%.0f", amount));
		(server.*func)(msg);
	}
}